

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O0

bool __thiscall GameData::IsGameOver(GameData *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int *piVar3;
  ostream *this_00;
  ostream local_220 [8];
  ofstream TempFile;
  int local_20;
  int local_1c;
  int j;
  int i;
  GameData *this_local;
  
  local_1c = 0;
  do {
    if (3 < local_1c) {
      piVar3 = std::max<int>(&this->my_best,&this->score);
      this->my_best = *piVar3;
      _Var2 = std::operator|(_S_out,_S_bin);
      std::ofstream::ofstream(local_220,"2048GAME.data",_Var2);
      bVar1 = std::ofstream::is_open();
      if ((bVar1 & 1) == 0) {
        this_00 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_80fd);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::ostream::operator<<(local_220,this->my_best);
      }
      std::ofstream::close();
      std::ofstream::~ofstream(local_220);
      return true;
    }
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      if (this->num[local_1c][local_20] == 0) {
        return false;
      }
      if ((-1 < local_1c + -1) &&
         (this->num[local_1c + -1][local_20] == this->num[local_1c][local_20])) {
        return false;
      }
      if ((local_1c + 1 < 4) && (this->num[local_1c + 1][local_20] == this->num[local_1c][local_20])
         ) {
        return false;
      }
      if ((-1 < local_20 + -1) &&
         (this->num[local_1c][local_20 + -1] == this->num[local_1c][local_20])) {
        return false;
      }
      if ((local_20 + 1 < 4) && (this->num[local_1c][local_20 + 1] == this->num[local_1c][local_20])
         ) {
        return false;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool GameData::IsGameOver() {
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 4; j++) {
            if (num[i][j] == 0)return false;
            if (i - 1 >= 0 && num[i - 1][j] == num[i][j])return false;
            if (i + 1 < 4 && num[i + 1][j] == num[i][j])return false;
            if (j - 1 >= 0 && num[i][j - 1] == num[i][j])return false;
            if (j + 1 < 4 && num[i][j + 1] == num[i][j])return false;
        }
    }
    my_best = std::max(my_best, score);
    std::ofstream TempFile("2048GAME.data",std::ios::out | std::ios::binary);
    if(TempFile.is_open())
        TempFile<<my_best;
    else
        std::cout<<"存储最佳分数失败！"<<std::endl;
    TempFile.close();
    return true;
}